

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rrVertexPacket.cpp
# Opt level: O3

VertexPacket * __thiscall rr::VertexPacketAllocator::alloc(VertexPacketAllocator *this)

{
  pointer ppVVar1;
  VertexPacket *pVVar2;
  pointer ppVVar3;
  vector<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_> local_28;
  
  ppVVar3 = (this->m_singleAllocPool).
            super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
            super__Vector_impl_data._M_finish;
  if ((this->m_singleAllocPool).
      super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
      super__Vector_impl_data._M_start == ppVVar3) {
    allocArray(&local_28,this,8);
    ppVVar3 = (this->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
              super__Vector_impl_data._M_start;
    ppVVar1 = (this->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage;
    (this->m_singleAllocPool).
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_start =
         local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
         _M_impl.super__Vector_impl_data._M_start;
    (this->m_singleAllocPool).
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
         _M_impl.super__Vector_impl_data._M_finish;
    (this->m_singleAllocPool).
    super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
         _M_impl.super__Vector_impl_data._M_end_of_storage;
    local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
    local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if (ppVVar3 != (pointer)0x0) {
      operator_delete(ppVVar3,(long)ppVVar1 - (long)ppVVar3);
      if (local_28.super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_28.
                        super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_28.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_28.
                              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
    }
    ppVVar3 = (this->m_singleAllocPool).
              super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  }
  pVVar2 = ppVVar3[-1];
  (this->m_singleAllocPool).
  super__Vector_base<rr::VertexPacket_*,_std::allocator<rr::VertexPacket_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppVVar3 + -1;
  return pVVar2;
}

Assistant:

VertexPacket* VertexPacketAllocator::alloc (void)
{
	const size_t poolSize = 8;

	if (m_singleAllocPool.empty())
		m_singleAllocPool = allocArray(poolSize);

	VertexPacket* packet = *--m_singleAllocPool.end();
	m_singleAllocPool.pop_back();
	return packet;
}